

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * rbuObjIterGetIndexWhere(sqlite3rbu *p,RbuObjIter *pIter)

{
  uchar uVar1;
  int iVar2;
  uchar *puVar3;
  int local_48;
  int iStack_44;
  char c;
  int i;
  int nParen;
  char *zSql;
  char *pcStack_30;
  int rc2;
  char *zRet;
  sqlite3_stmt *psStack_20;
  int rc;
  sqlite3_stmt *pStmt;
  RbuObjIter *pIter_local;
  sqlite3rbu *p_local;
  
  psStack_20 = (sqlite3_stmt *)0x0;
  zRet._4_4_ = p->rc;
  pcStack_30 = (char *)0x0;
  pStmt = (sqlite3_stmt *)pIter;
  pIter_local = (RbuObjIter *)p;
  if (zRet._4_4_ == 0) {
    zRet._4_4_ = prepareAndCollectError
                           (p->dbMain,&stack0xffffffffffffffe0,&p->zErrmsg,
                            "SELECT trim(sql) FROM sqlite_master WHERE type=\'index\' AND name=?");
  }
  if (zRet._4_4_ == 0) {
    zRet._4_4_ = sqlite3_bind_text(psStack_20,1,*(char **)(pStmt + 0x60),-1,
                                   (_func_void_void_ptr *)0x0);
    if (((zRet._4_4_ == 0) && (iVar2 = sqlite3_step(psStack_20), iVar2 == 100)) &&
       (puVar3 = sqlite3_column_text(psStack_20,0), puVar3 != (uchar *)0x0)) {
      iStack_44 = 0;
      for (local_48 = 0; puVar3[local_48] != '\0'; local_48 = local_48 + 1) {
        uVar1 = puVar3[local_48];
        if (uVar1 == '(') {
          iStack_44 = iStack_44 + 1;
        }
        else if (uVar1 == ')') {
          iStack_44 = iStack_44 + -1;
          if (iStack_44 == 0) {
            local_48 = local_48 + 1;
            break;
          }
        }
        else if (((uVar1 == '\"') || (uVar1 == '\'')) || (uVar1 == '`')) {
          while( true ) {
            do {
              iVar2 = local_48;
              local_48 = iVar2 + 1;
            } while (puVar3[local_48] != uVar1);
            if (puVar3[iVar2 + 2] != uVar1) break;
            local_48 = iVar2 + 2;
          }
        }
        else if (uVar1 == '[') {
          do {
            local_48 = local_48 + 1;
          } while (puVar3[local_48] != ']');
        }
      }
      if (puVar3[local_48] != '\0') {
        pcStack_30 = rbuStrndup((char *)(puVar3 + local_48),(int *)((long)&zRet + 4));
      }
    }
    iVar2 = sqlite3_finalize(psStack_20);
    if (zRet._4_4_ == 0) {
      zRet._4_4_ = iVar2;
    }
  }
  *(int *)&pIter_local->abNotNull = zRet._4_4_;
  return pcStack_30;
}

Assistant:

static char *rbuObjIterGetIndexWhere(sqlite3rbu *p, RbuObjIter *pIter){
  sqlite3_stmt *pStmt = 0;
  int rc = p->rc;
  char *zRet = 0;

  if( rc==SQLITE_OK ){
    rc = prepareAndCollectError(p->dbMain, &pStmt, &p->zErrmsg,
        "SELECT trim(sql) FROM sqlite_master WHERE type='index' AND name=?"
    );
  }
  if( rc==SQLITE_OK ){
    int rc2;
    rc = sqlite3_bind_text(pStmt, 1, pIter->zIdx, -1, SQLITE_STATIC);
    if( rc==SQLITE_OK && SQLITE_ROW==sqlite3_step(pStmt) ){
      const char *zSql = (const char*)sqlite3_column_text(pStmt, 0);
      if( zSql ){
        int nParen = 0;           /* Number of open parenthesis */
        int i;
        for(i=0; zSql[i]; i++){
          char c = zSql[i];
          if( c=='(' ){
            nParen++;
          }
          else if( c==')' ){
            nParen--;
            if( nParen==0 ){
              i++;
              break;
            }
          }else if( c=='"' || c=='\'' || c=='`' ){
            for(i++; 1; i++){
              if( zSql[i]==c ){
                if( zSql[i+1]!=c ) break;
                i++;
              }
            }
          }else if( c=='[' ){
            for(i++; 1; i++){
              if( zSql[i]==']' ) break;
            }
          }
        }
        if( zSql[i] ){
          zRet = rbuStrndup(&zSql[i], &rc);
        }
      }
    }

    rc2 = sqlite3_finalize(pStmt);
    if( rc==SQLITE_OK ) rc = rc2;
  }

  p->rc = rc;
  return zRet;
}